

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

bool __thiscall CPath::create_directory_recursive(CPath *this)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  undefined1 uVar4;
  char *ts;
  path tp;
  
  std::filesystem::__cxx11::path::path(&tp);
  ts = (this->super_path)._M_pathname._M_dataplus._M_p;
  pcVar3 = ts + (*ts == '/');
  do {
    uVar4 = *pcVar3 == '\0';
    if ((bool)uVar4) {
LAB_0018317a:
      std::filesystem::__cxx11::path::~path(&tp);
      return (bool)uVar4;
    }
    pcVar3 = strchr(pcVar3,0x2f);
    if (pcVar3 == (char *)0x0) {
      std::filesystem::__cxx11::path::assign<char*>(&tp,&ts);
      bVar1 = std::filesystem::exists(&tp);
      uVar4 = 1;
      if (!bVar1) {
        uVar4 = std::filesystem::create_directory(&tp);
      }
      goto LAB_0018317a;
    }
    *pcVar3 = '\0';
    std::filesystem::__cxx11::path::assign<char*>(&tp,&ts);
    bVar1 = std::filesystem::exists(&tp);
    if (!bVar1) {
      cVar2 = std::filesystem::create_directory(&tp);
      if (cVar2 == '\0') goto LAB_0018317a;
    }
    *pcVar3 = '/';
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

bool create_directory_recursive()
	{
		fs::path tp;
		char* ts = const_cast<char*>(c_str());
		char* sep = ts;

		// Пропускаем корневой каталог, если он указан. Его мы не создадим.
		if(*sep == preferred_separator) sep++;

		while(*sep != '\0')
		{
			sep = strchr(sep, preferred_separator);
			if(sep != nullptr)
			{
				*sep = '\0';
				tp.assign(ts);
				if(!fs::exists(tp))
				{
					if(!fs::create_directory(tp))
						return false;
				}

				*sep = preferred_separator;
				sep++;
			}
			else
			{
				tp.assign(ts);
				if(fs::exists(tp))
					return true;

				return fs::create_directory(tp);
			}
		}

		return true;
	}